

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O0

void __thiscall jbcoin::Generator::Generator(Generator *this,Seed *seed)

{
  pointer __dest;
  uint8_t *__src;
  size_t __n;
  Blob local_50;
  undefined1 local_28 [8];
  uint128 ui;
  Seed *seed_local;
  Generator *this_local;
  
  ui.pn._8_8_ = seed;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->gen_);
  base_uint<128UL,_void>::base_uint((base_uint<128UL,_void> *)local_28);
  __dest = base_uint<128UL,_void>::data((base_uint<128UL,_void> *)local_28);
  __src = Seed::data((Seed *)ui.pn._8_8_);
  __n = Seed::size((Seed *)ui.pn._8_8_);
  memcpy(__dest,__src,__n);
  generateRootDeterministicPublicKey(&local_50,(uint128 *)local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->gen_,&local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_50);
  return;
}

Assistant:

explicit
    Generator (Seed const& seed)
    {
        // FIXME: Avoid copying the seed into a uint128 key only to have
        //        generateRootDeterministicPublicKey copy out of it.
        uint128 ui;
        std::memcpy(ui.data(),
            seed.data(), seed.size());
        gen_ = generateRootDeterministicPublicKey(ui);
    }